

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O3

void luaV_concat(lua_State *L,int total)

{
  long lVar1;
  byte bVar2;
  ulong uVar3;
  TString *pTVar4;
  byte bVar5;
  long lVar6;
  long lVar7;
  ulong l;
  StkId pSVar8;
  StkId pSVar9;
  size_t sVar10;
  int iVar11;
  ulong uVar12;
  char buff [40];
  char local_58 [40];
  
  if (total != 1) {
    pSVar8 = (L->top).p;
    do {
      if ((byte)((*(byte *)((long)pSVar8 + -0x18) & 0xf) - 3) < 2) {
        bVar2 = *(byte *)((long)pSVar8 + -8);
        if ((bVar2 & 0xf) != 4) {
          if ((bVar2 & 0xf) != 3) goto LAB_00116c86;
          luaO_tostring(L,&pSVar8[-1].val);
          bVar2 = *(byte *)((long)pSVar8 + -8);
        }
        pSVar9 = pSVar8 + -2;
        if (bVar2 == 0x44) {
          bVar5 = *(byte *)((long)pSVar8 + -0x18);
          if (pSVar8[-1].val.value_.f[0xb] != (_func_int_lua_State_ptr)0x0) goto LAB_00116c9c;
          iVar11 = 1;
          if ((bVar5 & 0xf) == 3) {
            luaO_tostring(L,&pSVar9->val);
          }
        }
        else {
          bVar5 = *(byte *)((long)pSVar8 + -0x18);
LAB_00116c9c:
          if ((bVar5 == 0x44) && ((pSVar9->val).value_.f[0xb] == (_func_int_lua_State_ptr)0x0)) {
            pSVar8[-2].val.value_ = pSVar8[-1].val.value_;
            *(byte *)((long)pSVar8 + -0x18) = bVar2;
            goto LAB_00116c8e;
          }
          lVar6 = *(long *)(pSVar8 + -1);
          l = (ulong)*(byte *)(lVar6 + 0xb);
          if (l == 0xff) {
            l = *(ulong *)(lVar6 + 0x10);
          }
          uVar12 = 1;
          if (1 < total) {
            uVar12 = 1;
            do {
              bVar2 = (pSVar9->val).tt_ & 0xf;
              if (bVar2 != 4) {
                if (bVar2 != 3) goto LAB_00116d29;
                luaO_tostring(L,&pSVar9->val);
              }
              uVar3 = (ulong)*(byte *)(*(long *)pSVar9 + 0xb);
              if (uVar3 == 0xff) {
                uVar3 = *(ulong *)(*(long *)pSVar9 + 0x10);
              }
              if (0x7fffffffffffffdf - l <= uVar3) {
                (L->top).p = pSVar8 + -(ulong)(uint)total;
                luaG_runerror(L,"string length overflow");
              }
              l = l + uVar3;
              uVar12 = uVar12 + 1;
              pSVar9 = pSVar9 + -1;
            } while ((uint)total != uVar12);
            uVar12 = (ulong)(uint)total;
          }
LAB_00116d29:
          uVar3 = uVar12 & 0xffffffff;
          if (l < 0x29) {
            lVar6 = uVar3 + 1;
            pSVar9 = pSVar8 + -uVar3;
            lVar7 = 0;
            do {
              lVar1 = *(long *)pSVar9;
              sVar10 = (size_t)*(byte *)(lVar1 + 0xb);
              if (sVar10 == 0xff) {
                sVar10 = *(size_t *)(lVar1 + 0x10);
              }
              memcpy(local_58 + lVar7,(void *)(lVar1 + 0x18),sVar10);
              lVar7 = lVar7 + sVar10;
              lVar6 = lVar6 + -1;
              pSVar9 = pSVar9 + 1;
            } while (1 < lVar6);
            pTVar4 = luaS_newlstr(L,local_58,l);
          }
          else {
            pTVar4 = luaS_createlngstrobj(L,l);
            lVar6 = uVar3 + 1;
            pSVar9 = pSVar8 + -uVar3;
            lVar7 = 0;
            do {
              lVar1 = *(long *)pSVar9;
              sVar10 = (size_t)*(byte *)(lVar1 + 0xb);
              if (sVar10 == 0xff) {
                sVar10 = *(size_t *)(lVar1 + 0x10);
              }
              memcpy(pTVar4->contents + lVar7,(void *)(lVar1 + 0x18),sVar10);
              lVar7 = lVar7 + sVar10;
              lVar6 = lVar6 + -1;
              pSVar9 = pSVar9 + 1;
            } while (1 < lVar6);
          }
          *(TString **)(pSVar8 + -uVar3) = pTVar4;
          pSVar8[-uVar3].val.tt_ = pTVar4->tt | 0x40;
          iVar11 = (int)uVar12 + -1;
        }
      }
      else {
LAB_00116c86:
        luaT_tryconcatTM(L);
LAB_00116c8e:
        iVar11 = 1;
      }
      total = total - iVar11;
      pSVar8 = (L->top).p + -(long)iVar11;
      (L->top).p = pSVar8;
    } while (1 < total);
  }
  return;
}

Assistant:

void luaV_concat (lua_State *L, int total) {
  if (total == 1)
    return;  /* "all" values already concatenated */
  do {
    StkId top = L->top.p;
    int n = 2;  /* number of elements handled in this pass (at least 2) */
    if (!(ttisstring(s2v(top - 2)) || cvt2str(s2v(top - 2))) ||
        !tostring(L, s2v(top - 1)))
      luaT_tryconcatTM(L);  /* may invalidate 'top' */
    else if (isemptystr(s2v(top - 1)))  /* second operand is empty? */
      cast_void(tostring(L, s2v(top - 2)));  /* result is first operand */
    else if (isemptystr(s2v(top - 2))) {  /* first operand is empty string? */
      setobjs2s(L, top - 2, top - 1);  /* result is second op. */
    }
    else {
      /* at least two non-empty string values; get as many as possible */
      size_t tl = tsslen(tsvalue(s2v(top - 1)));
      TString *ts;
      /* collect total length and number of strings */
      for (n = 1; n < total && tostring(L, s2v(top - n - 1)); n++) {
        size_t l = tsslen(tsvalue(s2v(top - n - 1)));
        if (l_unlikely(l >= MAX_SIZE - sizeof(TString) - tl)) {
          L->top.p = top - total;  /* pop strings to avoid wasting stack */
          luaG_runerror(L, "string length overflow");
        }
        tl += l;
      }
      if (tl <= LUAI_MAXSHORTLEN) {  /* is result a short string? */
        char buff[LUAI_MAXSHORTLEN];
        copy2buff(top, n, buff);  /* copy strings to buffer */
        ts = luaS_newlstr(L, buff, tl);
      }
      else {  /* long string; copy strings directly to final result */
        ts = luaS_createlngstrobj(L, tl);
        copy2buff(top, n, getlngstr(ts));
      }
      setsvalue2s(L, top - n, ts);  /* create result */
    }
    total -= n - 1;  /* got 'n' strings to create one new */
    L->top.p -= n - 1;  /* popped 'n' strings and pushed one */
  } while (total > 1);  /* repeat until only 1 result left */
}